

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O0

bool ImGui::BeginTabItem(char *label,bool *p_open,ImGuiTabItemFlags flags)

{
  ImGuiTabBar *tab_bar_00;
  ImGuiTabItem *pIVar1;
  ImGuiTabItem *tab;
  bool ret;
  ImGuiTabBar *tab_bar;
  ImGuiWindow *window;
  ImGuiContext *g;
  ImGuiTabItemFlags flags_local;
  bool *p_open_local;
  char *label_local;
  
  if ((GImGui->CurrentWindow->SkipItems & 1U) == 0) {
    tab_bar_00 = GImGui->CurrentTabBar;
    if (tab_bar_00 == (ImGuiTabBar *)0x0) {
      __assert_fail("tab_bar && \"Needs to be called between BeginTabBar() and EndTabBar()!\"",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/awolven[P]cimgui/imgui/imgui_widgets.cpp"
                    ,0x1a6b,"bool ImGui::BeginTabItem(const char *, bool *, ImGuiTabItemFlags)");
    }
    label_local._7_1_ = TabItemEx(tab_bar_00,label,p_open,flags);
    if ((label_local._7_1_) && ((flags & 8U) == 0)) {
      pIVar1 = ImVector<ImGuiTabItem>::operator[](&tab_bar_00->Tabs,(int)tab_bar_00->LastTabItemIdx)
      ;
      PushOverrideID(pIVar1->ID);
    }
  }
  else {
    label_local._7_1_ = false;
  }
  return label_local._7_1_;
}

Assistant:

bool    ImGui::BeginTabItem(const char* label, bool* p_open, ImGuiTabItemFlags flags)
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = g.CurrentWindow;
    if (window->SkipItems)
        return false;

    ImGuiTabBar* tab_bar = g.CurrentTabBar;
    if (tab_bar == NULL)
    {
        IM_ASSERT(tab_bar && "Needs to be called between BeginTabBar() and EndTabBar()!");
        return false; // FIXME-ERRORHANDLING
    }
    bool ret = TabItemEx(tab_bar, label, p_open, flags);
    if (ret && !(flags & ImGuiTabItemFlags_NoPushId))
    {
        ImGuiTabItem* tab = &tab_bar->Tabs[tab_bar->LastTabItemIdx];
        PushOverrideID(tab->ID); // We already hashed 'label' so push into the ID stack directly instead of doing another hash through PushID(label)
    }
    return ret;
}